

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahocorasick.c
# Opt level: O0

AC_STATUS_t ac_trie_add(AC_TRIE_t *thiz,AC_PATTERN_t *patt,int copy)

{
  long *in_RSI;
  undefined8 *in_RDI;
  AC_ALPHABET_t alpha;
  ACT_NODE_t *next;
  ACT_NODE_t *n;
  size_t i;
  int in_stack_ffffffffffffffc4;
  ACT_NODE_t *in_stack_ffffffffffffffc8;
  ACT_NODE_t *nod;
  ulong local_28;
  AC_STATUS_t local_4;
  
  if (*(short *)(in_RDI + 2) == 0) {
    local_4 = ACERR_TRIE_CLOSED;
  }
  else if (in_RSI[1] == 0) {
    local_4 = ACERR_ZERO_PATTERN;
  }
  else if ((ulong)in_RSI[1] < 0x401) {
    nod = (ACT_NODE_t *)*in_RDI;
    for (local_28 = 0; local_28 < (ulong)in_RSI[1]; local_28 = local_28 + 1) {
      in_stack_ffffffffffffffc4 =
           CONCAT13(*(AC_ALPHABET_t *)(*in_RSI + local_28),(int3)in_stack_ffffffffffffffc4);
      in_stack_ffffffffffffffc8 = node_find_next(nod,*(AC_ALPHABET_t *)(*in_RSI + local_28));
      if (in_stack_ffffffffffffffc8 == (ACT_NODE_t *)0x0) {
        in_stack_ffffffffffffffc8 =
             node_create_next((ACT_NODE_t *)0x0,
                              (AC_ALPHABET_t)((uint)in_stack_ffffffffffffffc4 >> 0x18));
        in_stack_ffffffffffffffc8->depth = nod->depth + 1;
      }
      nod = in_stack_ffffffffffffffc8;
    }
    if (nod->final == 0) {
      nod->final = 1;
      node_accept_pattern(nod,(AC_PATTERN_t *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      in_RDI[1] = in_RDI[1] + 1;
      local_4 = ACERR_SUCCESS;
    }
    else {
      local_4 = ACERR_DUPLICATE_PATTERN;
    }
  }
  else {
    local_4 = ACERR_LONG_PATTERN;
  }
  return local_4;
}

Assistant:

AC_STATUS_t ac_trie_add (AC_TRIE_t *thiz, AC_PATTERN_t *patt, int copy)
{
    size_t i;
    ACT_NODE_t *n = thiz->root;
    ACT_NODE_t *next;
    AC_ALPHABET_t alpha;
    
    if(!thiz->trie_open)
        return ACERR_TRIE_CLOSED;
    
    if (!patt->ptext.length)
        return ACERR_ZERO_PATTERN;
    
    if (patt->ptext.length > AC_PATTRN_MAX_LENGTH)
        return ACERR_LONG_PATTERN;
    
    for (i = 0; i < patt->ptext.length; i++)
    {
        alpha = patt->ptext.astring[i];
        if ((next = node_find_next (n, alpha)))
        {
            n = next;
            continue;
        }
        else
        {
            next = node_create_next (n, alpha);
            next->depth = n->depth + 1;
            n = next;
        }
    }
    
    if(n->final)
        return ACERR_DUPLICATE_PATTERN;
    
    n->final = 1;
    node_accept_pattern (n, patt, copy);
    thiz->patterns_count++;
    
    return ACERR_SUCCESS;
}